

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O1

IdentifierPath * __thiscall
soul::IdentifierPath::fromSecondPart(IdentifierPath *__return_storage_ptr__,IdentifierPath *this)

{
  Identifier *pIVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (1 < (this->pathSections).numActive) {
    (__return_storage_ptr__->pathSections).items =
         (Identifier *)(__return_storage_ptr__->pathSections).space;
    (__return_storage_ptr__->pathSections).numActive = 0;
    (__return_storage_ptr__->pathSections).numAllocated = 8;
    if (1 < (this->pathSections).numActive) {
      uVar3 = 1;
      do {
        pIVar1 = (this->pathSections).items;
        ArrayWithPreallocation<soul::Identifier,_8UL>::reserve
                  (&__return_storage_ptr__->pathSections,
                   (__return_storage_ptr__->pathSections).numActive + 1);
        sVar2 = (__return_storage_ptr__->pathSections).numActive;
        (__return_storage_ptr__->pathSections).items[sVar2].name = pIVar1[uVar3].name;
        (__return_storage_ptr__->pathSections).numActive = sVar2 + 1;
        uVar3 = uVar3 + 1;
      } while (uVar3 < (this->pathSections).numActive);
    }
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("size() > 1","fromSecondPart",0xf5);
}

Assistant:

IdentifierPath fromSecondPart() const
    {
        SOUL_ASSERT (size() > 1);
        IdentifierPath p;

        for (size_t i = 1; i < pathSections.size(); ++i)
            p.pathSections.push_back (pathSections[i]);

        return p;
    }